

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EffectManager.cpp
# Opt level: O3

shared_ptr<Effect> __thiscall EffectManager::createEffect(EffectManager *this,string *effectName)

{
  iterator iVar1;
  Effect *__p;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<Effect> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
                  *)effectName,in_RDX);
  if (((_Base_ptr)&effectName->_M_string_length == iVar1._M_node) ||
     (*(long **)(iVar1._M_node + 2) == (long *)0x0)) {
    *(undefined8 *)&(this->m_effects)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m_effects)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    __p = (Effect *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x10))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Effect*>(&local_18,__p);
    _Var2._M_pi = extraout_RDX_00;
    if (__p == (Effect *)0x0) {
      *(undefined8 *)&(this->m_effects)._M_t._M_impl = 0;
      *(undefined8 *)&(this->m_effects)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
        _Var2._M_pi = extraout_RDX_01;
      }
    }
    else {
      *(Effect **)&(this->m_effects)._M_t._M_impl = __p;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &(this->m_effects)._M_t._M_impl.super__Rb_tree_header._M_header = local_18._M_pi;
    }
  }
  sVar3.super___shared_ptr<Effect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Effect,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Effect>)sVar3.super___shared_ptr<Effect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Effect> EffectManager::createEffect(const std::string& effectName) 
{
	auto it = m_effects.find(effectName);
	if (m_effects.end() == it) 
	{
		return nullptr;
	}

	auto& effectLauncher = it->second;
	if (!effectLauncher) 
	{
		return nullptr;
	}

	auto effect = std::shared_ptr<Effect>(effectLauncher->create());
	if (!effect) 
	{
		return nullptr;
	}

	return effect;
}